

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_names.cc
# Opt level: O0

bool prometheus::CheckLabelName(string *name,MetricType type)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  char *local_38;
  char *local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  mismatch;
  anon_class_1_0_00000001 validLabelCharacters;
  MetricType type_local;
  string *name_local;
  
  mismatch._M_current._4_4_ = type;
  bVar1 = anon_unknown_3::nameStartsValid(name);
  if (bVar1) {
    if (((mismatch._M_current._4_4_ == Histogram) && (bVar1 = std::operator==(name,"le"), bVar1)) ||
       ((mismatch._M_current._4_4_ == Summary && (bVar1 = std::operator==(name,"quantile"), bVar1)))
       ) {
      name_local._7_1_ = false;
    }
    else {
      local_30 = (char *)std::begin<std::__cxx11::string>(name);
      local_38 = (char *)std::end<std::__cxx11::string>(name);
      local_28 = std::
                 find_if_not<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::__0>
                           (local_30,local_38);
      local_48[0]._M_current = (char *)std::end<std::__cxx11::string>(name);
      name_local._7_1_ = __gnu_cxx::operator==(&local_28,local_48);
    }
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool CheckLabelName(const std::string& name, MetricType type) {
  if (!nameStartsValid(name)) {
    return false;
  }

  auto validLabelCharacters = [](char c) {
    return isLocaleIndependentAlphaNumeric(c) || c == '_';
  };

  if ((type == MetricType::Histogram && name == "le") ||
      (type == MetricType::Summary && name == "quantile")) {
    return false;
  }

  auto mismatch =
      std::find_if_not(std::begin(name), std::end(name), validLabelCharacters);
  return mismatch == std::end(name);
}